

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O3

void __thiscall
SQCompilation::CodegenVisitor::emitAssign(CodegenVisitor *this,Expr *lvalue,Expr *rvalue)

{
  SQUnsignedInteger *pSVar1;
  TreeOp TVar2;
  Node *this_00;
  SQFuncState *this_01;
  bool bVar3;
  SQInteger SVar4;
  SQInteger SVar5;
  SQInteger SVar6;
  bool old_dng;
  bool assignable;
  SQObject nameObj;
  bool local_41;
  SQObject local_40;
  anon_union_4_2_91d81cc7_for_SQInstruction_0 local_30;
  undefined1 local_2c;
  undefined1 local_2b;
  ushort local_2a;
  
  if ((((lvalue->super_Node)._op - TO_GETFIELD < 4) &&
      (*(int *)(lvalue[1].super_Node.super_ArenaObj._vptr_ArenaObj + 3) != 0x3a)) &&
     (bVar3 = canBeLiteral(this,(AccessExpr *)lvalue), bVar3)) {
    local_40 = SQFuncState::CreateString
                         (this->_fs,*(SQChar **)&lvalue[1].super_Node._coordinates.lineEnd,-1);
    SVar4 = SQFuncState::GetConstant(this->_fs,&local_40,0x7fffffff);
    this_00 = (Node *)lvalue[1].super_Node.super_ArenaObj._vptr_ArenaObj;
    bVar3 = this->_donot_get;
    this->_donot_get = false;
    Node::visit<SQCompilation::CodegenVisitor>(this_00,this);
    this->_donot_get = false;
    Node::visit<SQCompilation::CodegenVisitor>(&rvalue->super_Node,this);
    this->_donot_get = bVar3;
    emitFieldAssign(this,(int)SVar4);
    return;
  }
  this->_donot_get = true;
  Node::visit<SQCompilation::CodegenVisitor>(&lvalue->super_Node,this);
  this->_donot_get = false;
  Node::visit<SQCompilation::CodegenVisitor>(&rvalue->super_Node,this);
  this->_donot_get = false;
  TVar2 = (lvalue->super_Node)._op;
  if (TVar2 == TO_ID) {
    local_40 = SQFuncState::CreateString
                         (this->_fs,(SQChar *)lvalue[1].super_Node.super_ArenaObj._vptr_ArenaObj,-1)
    ;
    if ((local_40._type >> 0x1b & 1) != 0) {
      pSVar1 = &((local_40._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted
                ._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    local_41 = false;
    SVar4 = SQFuncState::GetLocalVariable(this->_fs,&local_40,&local_41);
    if (SVar4 == -1) {
      SVar4 = SQFuncState::GetOuterVariable(this->_fs,&local_40,&local_41);
      if (SVar4 == -1) {
        reportDiagnostic(this,&lvalue->super_Node,0x27);
      }
      else {
        if (local_41 == false) {
          reportDiagnostic(this,&lvalue->super_Node,0x29,
                           lvalue[1].super_Node.super_ArenaObj._vptr_ArenaObj);
        }
        SVar5 = SQFuncState::PopTarget(this->_fs);
        this_01 = this->_fs;
        SVar6 = SQFuncState::PushTarget(this_01,-1);
        local_2c = 0x28;
        local_2b = (undefined1)SVar6;
        local_30._arg1 = (SQInt32)SVar4;
        local_2a = (ushort)(byte)SVar5;
        SQFuncState::AddInstruction(this_01,(SQInstruction *)&local_30);
      }
    }
    else {
      if (local_41 == false) {
        reportDiagnostic(this,&lvalue->super_Node,0x29,
                         lvalue[1].super_Node.super_ArenaObj._vptr_ArenaObj);
      }
      SVar4 = SQFuncState::PopTarget(this->_fs);
      SVar5 = SQFuncState::TopTarget(this->_fs);
      local_2c = 10;
      local_2b = (undefined1)SVar5;
      local_30._arg1 = (SQInt32)SVar4;
      local_2a = 0;
      SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_30);
    }
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_40);
    return;
  }
  if ((TVar2 - TO_GETFIELD < 4) &&
     (*(int *)(lvalue[1].super_Node.super_ArenaObj._vptr_ArenaObj + 3) != 0x3a)) {
    emitFieldAssign(this,-1);
    return;
  }
  reportDiagnostic(this,&lvalue->super_Node,0x27);
  return;
}

Assistant:

void CodegenVisitor::emitAssign(Expr *lvalue, Expr * rvalue) {

    if (lvalue->isAccessExpr() && lvalue->asAccessExpr()->receiver()->op() != TO_BASE && canBeLiteral(lvalue->asAccessExpr())) {
        FieldAccessExpr *fieldAccess = lvalue->asAccessExpr()->asFieldAccessExpr();
        SQObject nameObj = _fs->CreateString(fieldAccess->fieldName());
        SQInteger constantI = _fs->GetConstant(nameObj);
        // arg1 is of int size, enough
        visitForceGet(fieldAccess->receiver());

        visitForceGet(rvalue);

        emitFieldAssign(constantI);
        return;
    }

    visitNoGet(lvalue);

    visitForceGet(rvalue);

    if (lvalue->op() == TO_ID) {
        Id *id = lvalue->asId();

        SQObjectPtr nameObj = _fs->CreateString(id->id());
        bool assignable = false;
        SQInteger pos = -1;

        if ((pos = _fs->GetLocalVariable(nameObj, assignable)) != -1) {
            if (!assignable)
                reportDiagnostic(lvalue, DiagnosticsId::DI_ASSIGN_TO_BINDING, id->id());

            SQInteger src = _fs->PopTarget();
            SQInteger dst = _fs->TopTarget();
            _fs->AddInstruction(_OP_MOVE, dst, src);
        }
        else if ((pos = _fs->GetOuterVariable(nameObj, assignable)) != -1) {
            if (!assignable)
                reportDiagnostic(lvalue, DiagnosticsId::DI_ASSIGN_TO_BINDING, id->id());

            SQInteger src = _fs->PopTarget();
            _fs->AddInstruction(_OP_SETOUTER, _fs->PushTarget(), pos, src);
        }
        else {
            reportDiagnostic(lvalue, DiagnosticsId::DI_ASSIGN_TO_EXPR);
        }
    }
    else if (lvalue->isAccessExpr()) {
        if (lvalue->asAccessExpr()->receiver()->op() != TO_BASE) {
            emitFieldAssign(-1);
        }
        else {
            reportDiagnostic(lvalue, DiagnosticsId::DI_ASSIGN_TO_EXPR);
        }
    }
    else {
        reportDiagnostic(lvalue, DiagnosticsId::DI_ASSIGN_TO_EXPR);
    }
}